

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TArray<ZCC_ConstantDef_*,_ZCC_ConstantDef_*>::~TArray
          (TArray<ZCC_ConstantDef_*,_ZCC_ConstantDef_*> *this)

{
  ZCC_ConstantDef **block;
  
  block = this->Array;
  if (block != (ZCC_ConstantDef **)0x0) {
    if (this->Count != 0) {
      DoDelete(this,0,this->Count - 1);
      block = this->Array;
    }
    M_Free(block);
    this->Array = (ZCC_ConstantDef **)0x0;
    this->Most = 0;
    this->Count = 0;
  }
  return;
}

Assistant:

~TArray ()
	{
		if (Array)
		{
			if (Count > 0)
			{
				DoDelete (0, Count-1);
			}
			M_Free (Array);
			Array = NULL;
			Count = 0;
			Most = 0;
		}
	}